

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

_Bool line_comment_herald(Env *env)

{
  State *pSVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  TSLexer *pTVar5;
  uint32_t rel;
  
  _Var3 = false;
  _Var2 = seq_from(env,"--",0);
  if (_Var2) {
    rel = 1;
    do {
      rel = rel + 1;
      pSVar1 = env->state;
      uVar4 = (pSVar1->lookahead).offset + rel;
      if (uVar4 < (pSVar1->lookahead).size) {
        pTVar5 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
      }
      else {
        advance_before(env,rel);
        pTVar5 = env->lexer;
      }
    } while (pTVar5->lookahead == 0x2d);
    pSVar1 = env->state;
    uVar4 = (pSVar1->lookahead).offset + rel;
    if (uVar4 < (pSVar1->lookahead).size) {
      pTVar5 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
    }
    else {
      advance_before(env,rel);
      pTVar5 = env->lexer;
    }
    _Var3 = symop_char(pTVar5->lookahead);
    _Var3 = !_Var3;
  }
  return _Var3;
}

Assistant:

static bool line_comment_herald(Env *env) {
  return seq(env, "--") && only_minus(env);
}